

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<unsigned_int>(XmlWriter *this,string *name,uint *attribute)

{
  XmlWriter *pXVar1;
  ostringstream oss;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
  pXVar1 = writeAttribute(this,name,&sStack_1b8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            std::ostringstream oss;
            oss << attribute;
            return writeAttribute( name, oss.str() );
        }